

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAbbrev.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFAbbreviationDeclarationSet::extract
          (DWARFAbbreviationDeclarationSet *this,DataExtractor Data,uint64_t *OffsetPtr)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  undefined1 local_d8 [8];
  DWARFAbbreviationDeclaration AbbrDecl;
  
  clear(this);
  AbbrDecl.FixedAttributeSize.Storage =
       (OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true>)*OffsetPtr;
  this->Offset = (uint64_t)AbbrDecl.FixedAttributeSize.Storage;
  DWARFAbbreviationDeclaration::DWARFAbbreviationDeclaration
            ((DWARFAbbreviationDeclaration *)local_d8);
  uVar3 = 0;
  do {
    bVar1 = DWARFAbbreviationDeclaration::extract
                      ((DWARFAbbreviationDeclaration *)local_d8,Data,OffsetPtr);
    if (!bVar1) {
      bVar1 = AbbrDecl.FixedAttributeSize.Storage !=
              (OptionalStorage<llvm::DWARFAbbreviationDeclaration::FixedSizeInfo,_true>)*OffsetPtr;
      SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>::~SmallVectorImpl
                ((SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec> *)&AbbrDecl);
      return bVar1;
    }
    uVar2 = local_d8._0_4_;
    if (this->FirstAbbrCode == 0) {
LAB_00d86228:
      this->FirstAbbrCode = uVar2;
      uVar3 = local_d8._0_4_;
    }
    else {
      uVar3 = uVar3 + 1;
      uVar2 = 0xffffffff;
      if (uVar3 != local_d8._0_4_) goto LAB_00d86228;
    }
    std::
    vector<llvm::DWARFAbbreviationDeclaration,_std::allocator<llvm::DWARFAbbreviationDeclaration>_>
    ::emplace_back<llvm::DWARFAbbreviationDeclaration>
              (&this->Decls,(DWARFAbbreviationDeclaration *)local_d8);
  } while( true );
}

Assistant:

bool DWARFAbbreviationDeclarationSet::extract(DataExtractor Data,
                                              uint64_t *OffsetPtr) {
  clear();
  const uint64_t BeginOffset = *OffsetPtr;
  Offset = BeginOffset;
  DWARFAbbreviationDeclaration AbbrDecl;
  uint32_t PrevAbbrCode = 0;
  while (AbbrDecl.extract(Data, OffsetPtr)) {
    if (FirstAbbrCode == 0) {
      FirstAbbrCode = AbbrDecl.getCode();
    } else {
      if (PrevAbbrCode + 1 != AbbrDecl.getCode()) {
        // Codes are not consecutive, can't do O(1) lookups.
        FirstAbbrCode = UINT32_MAX;
      }
    }
    PrevAbbrCode = AbbrDecl.getCode();
    Decls.push_back(std::move(AbbrDecl));
  }
  return BeginOffset != *OffsetPtr;
}